

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O1

char * __thiscall GEO::Delaunay::index(Delaunay *this,char *__s,int __c)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  bool bVar5;
  string local_30;
  
  pcVar3 = (char *)(ulong)this->cell_size_;
  bVar5 = pcVar3 != (char *)0x0;
  if (bVar5) {
    uVar4 = (int)__s * this->cell_v_stride_;
    pcVar2 = (char *)0x0;
    if (this->cell_to_v_[uVar4] != __c) {
      pcVar2 = (char *)0x0;
      do {
        if (pcVar3 + -1 == pcVar2) goto LAB_0016e506;
        iVar1 = (int)pcVar2;
        pcVar2 = pcVar2 + 1;
      } while (this->cell_to_v_[uVar4 + 1 + iVar1] != __c);
      bVar5 = pcVar2 < pcVar3;
    }
    if (bVar5) {
      return pcVar2;
    }
  }
LAB_0016e506:
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.h"
             ,"");
  geo_should_not_have_reached(&local_30,0x19b0);
}

Assistant:

index_t index(index_t c, signed_index_t v) const {
            geo_debug_assert(c < nb_cells());
            geo_debug_assert(v < (signed_index_t) nb_vertices());
            for(index_t iv = 0; iv < cell_size(); iv++) {
                if(cell_vertex(c, iv) == v) {
                    return iv;
                }
            }
            geo_assert_not_reached;
        }